

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPointSizeTests.cpp
# Opt level: O1

TestCaseGroup * vkt::tessellation::createGeometryPointSizeTests(TestContext *testCtx)

{
  uint arg0;
  TestNode *this;
  TestNode *node;
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  Flags *pFVar5;
  string desc;
  string name;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"point_size","Test point size");
  pFVar5 = createGeometryPointSizeTests::caseFlags;
  uVar2 = 0;
  do {
    arg0 = *pFVar5;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    uVar1 = (int)uVar2 - 1;
    if (1 < uVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vertex_set",10);
    }
    uVar4 = arg0 & 1;
    if ((0x55UL >> (uVar2 & 0x3f) & 1) == 0) {
      pcVar3 = "_";
      if (uVar1 < 2) {
        pcVar3 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,(ulong)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"evaluation_set",0xe);
    }
    if (uVar2 == 6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"control_pass_eval_add",0x15);
    }
    if ((0x4bUL >> (uVar2 & 0x3f) & 1) == 0) {
      pcVar3 = "";
      if (uVar2 != 2) {
        pcVar3 = "_";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar3,(ulong)(uVar2 != 2));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"geometry_set",0xc);
    }
    if (uVar2 == 6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"geometry_add",0xc);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    if (1 < uVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"set point size in vertex shader",0x1f);
    }
    if ((0x55UL >> ((byte)uVar2 & 0x3f) & 1) == 0) {
      pcVar3 = ", ";
      if (uVar1 < 2) {
        pcVar3 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar3,(ulong)(uVar4 * 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"set point size in tessellation evaluation shader",0x30);
    }
    if (uVar2 == 6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"add to point size in tessellation shader",0x28);
    }
    if ((0x4bUL >> ((byte)uVar2 & 0x3f) & 1) == 0) {
      pcVar3 = ", ";
      if (uVar2 == 2) {
        pcVar3 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar3,(ulong)((uint)(uVar2 != 2) * 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"set point size in geometry shader",0x21);
    }
    if (uVar2 == 6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"add to point size in geometry shader",0x24);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    node = (TestNode *)
           createFunctionCaseWithPrograms<unsigned_int>
                     (this->m_testCtx,NODETYPE_SELF_VALIDATE,&local_1c8,&local_1e8,
                      anon_unknown_1::initPrograms,anon_unknown_1::test,arg0);
    tcu::TestNode::addChild(this,node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    uVar2 = uVar2 + 1;
    pFVar5 = pFVar5 + 1;
  } while (uVar2 != 7);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createGeometryPointSizeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "point_size", "Test point size"));

	static const Flags caseFlags[] =
	{
		FLAG_VERTEX_SET,
							FLAG_TESSELLATION_EVALUATION_SET,
																	FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_EVALUATION_SET,
		FLAG_VERTEX_SET |											FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_EVALUATION_SET	|	FLAG_GEOMETRY_SET,
		FLAG_VERTEX_SET	|	FLAG_TESSELLATION_ADD				|	FLAG_GEOMETRY_ADD,
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(caseFlags); ++ndx)
	{
		const std::string name = getTestCaseName       (caseFlags[ndx]);
		const std::string desc = getTestCaseDescription(caseFlags[ndx]);

		addFunctionCaseWithPrograms(group.get(), name, desc, initPrograms, test, caseFlags[ndx]);
	}

	return group.release();
}